

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall
tinyxml2::XMLUnknown::ParseDeep(XMLUnknown *this,char *p,StrPair *param_2,int *curLineNumPtr)

{
  char *pcVar1;
  
  pcVar1 = StrPair::ParseText(&(this->super_XMLNode)._value,p,">",2,curLineNumPtr);
  if (pcVar1 == (char *)0x0) {
    XMLDocument::SetError
              ((this->super_XMLNode)._document,XML_ERROR_PARSING_UNKNOWN,p,(char *)0x0,
               (this->super_XMLNode)._parseLineNum);
  }
  return pcVar1;
}

Assistant:

char* XMLUnknown::ParseDeep( char* p, StrPair*, int* curLineNumPtr )
{
    // Unknown parses as text.
    const char* start = p;

    p = _value.ParseText( p, ">", StrPair::NEEDS_NEWLINE_NORMALIZATION, curLineNumPtr );
    if ( !p ) {
        _document->SetError( XML_ERROR_PARSING_UNKNOWN, start, 0, _parseLineNum );
    }
    return p;
}